

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeRTASBuilderGetBuildPropertiesExt
          (ze_rtas_builder_ext_handle_t hBuilder,
          ze_rtas_builder_build_op_ext_desc_t *pBuildOpDescriptor,
          ze_rtas_builder_ext_properties_t *pProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010e0e0 != (code *)0x0) {
    zVar1 = (*DAT_0010e0e0)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderGetBuildPropertiesExt(
        ze_rtas_builder_ext_handle_t hBuilder,          ///< [in] handle of builder object
        const ze_rtas_builder_build_op_ext_desc_t* pBuildOpDescriptor,  ///< [in] pointer to build operation descriptor
        ze_rtas_builder_ext_properties_t* pProperties   ///< [in,out] query result for builder properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetBuildPropertiesExt = context.zeDdiTable.RTASBuilder.pfnGetBuildPropertiesExt;
        if( nullptr != pfnGetBuildPropertiesExt )
        {
            result = pfnGetBuildPropertiesExt( hBuilder, pBuildOpDescriptor, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }